

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringRef.cpp
# Opt level: O2

void __thiscall
llvm::StringRef::split
          (StringRef *this,SmallVectorImpl<llvm::StringRef> *A,StringRef Separator,int MaxSplit,
          bool KeepEmpty)

{
  char *pcVar1;
  size_t sVar2;
  size_t sVar3;
  ulong uVar4;
  undefined3 in_register_00000089;
  bool bVar5;
  StringRef Str;
  StringRef local_70;
  char *local_60;
  SmallVectorImpl<llvm::StringRef> *local_58;
  undefined4 local_4c;
  StringRef local_48;
  byte local_31;
  
  local_4c = CONCAT31(in_register_00000089,KeepEmpty);
  local_60 = Separator.Data;
  local_48.Data = this->Data;
  local_48.Length = this->Length;
  local_31 = !KeepEmpty;
  local_58 = A;
  while ((bVar5 = MaxSplit != 0, MaxSplit = MaxSplit + -1, bVar5 &&
         (Str.Length = Separator.Length, Str.Data = local_60, sVar3 = find(&local_48,Str,0),
         sVar2 = local_48.Length, pcVar1 = local_48.Data, sVar3 != 0xffffffffffffffff))) {
    if ((local_31 & sVar3 == 0) == 0) {
      local_70.Length = sVar3;
      if (local_48.Length < sVar3) {
        local_70.Length = local_48.Length;
      }
      local_70.Data = local_48.Data;
      SmallVectorTemplateBase<llvm::StringRef,_true>::push_back
                (&local_58->super_SmallVectorTemplateBase<llvm::StringRef,_true>,&local_70);
    }
    uVar4 = sVar3 + Separator.Length;
    if (sVar2 < uVar4) {
      uVar4 = sVar2;
    }
    local_48.Data = pcVar1 + uVar4;
    local_48.Length = sVar2 - uVar4;
  }
  if (((char)local_4c != '\0') || (local_48.Length != 0)) {
    SmallVectorTemplateBase<llvm::StringRef,_true>::push_back
              (&local_58->super_SmallVectorTemplateBase<llvm::StringRef,_true>,&local_48);
  }
  return;
}

Assistant:

void StringRef::split(SmallVectorImpl<StringRef> &A,
                      StringRef Separator, int MaxSplit,
                      bool KeepEmpty) const {
  StringRef S = *this;

  // Count down from MaxSplit. When MaxSplit is -1, this will just split
  // "forever". This doesn't support splitting more than 2^31 times
  // intentionally; if we ever want that we can make MaxSplit a 64-bit integer
  // but that seems unlikely to be useful.
  while (MaxSplit-- != 0) {
    size_t Idx = S.find(Separator);
    if (Idx == npos)
      break;

    // Push this split.
    if (KeepEmpty || Idx > 0)
      A.push_back(S.slice(0, Idx));

    // Jump forward.
    S = S.slice(Idx + Separator.size(), npos);
  }

  // Push the tail.
  if (KeepEmpty || !S.empty())
    A.push_back(S);
}